

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrUtils-CPConv_IConv.c
# Opt level: O3

UINT8 CPConv_StrConvert(CPCONV *cpc,size_t *outSize,char **outStr,size_t inSize,char *inStr)

{
  int iVar1;
  char *pcVar2;
  UINT8 UVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  char *outPtr;
  size_t remBytesIn;
  char *inPtr;
  size_t remBytesOut;
  char *local_60;
  size_t local_58;
  size_t *local_50;
  char *local_48;
  size_t local_40;
  int *local_38;
  
  iconv(cpc->hIConv,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
  local_58 = inSize;
  if (inSize == 0) {
    sVar7 = cpc->cpfCharSize;
    if (sVar7 == 1) {
      sVar4 = strlen(inStr);
    }
    else if (sVar7 == 2) {
      sVar5 = 0xfffffffffffffffe;
      do {
        sVar4 = sVar5 + 2;
        lVar8 = sVar5 + 2;
        sVar5 = sVar4;
      } while (*(short *)(inStr + lVar8) != 0);
    }
    else if (sVar7 == 4) {
      sVar5 = 0xfffffffffffffffc;
      do {
        sVar4 = sVar5 + 4;
        lVar8 = sVar5 + 4;
        sVar5 = sVar4;
      } while (*(int *)(inStr + lVar8) != 0);
    }
    else {
      sVar4 = 0;
    }
    local_58 = sVar4 + sVar7;
    if (local_58 == 0) {
      sVar7 = 0;
      UVar3 = '\0';
      goto LAB_00122a08;
    }
  }
  pcVar2 = *outStr;
  local_48 = inStr;
  if (pcVar2 == (char *)0x0) {
    sVar4 = (local_58 * cpc->cptCharSize * 3 >> 1) / cpc->cpfCharSize;
    local_60 = (char *)malloc(sVar4);
    *outStr = local_60;
  }
  else {
    sVar4 = *outSize;
    local_60 = pcVar2;
  }
  local_40 = sVar4;
  sVar5 = iconv(cpc->hIConv,&local_48,&local_58,&local_60,&local_40);
  if (sVar5 == 0xffffffffffffffff) {
    pcVar6 = (char *)0x0;
    local_50 = outSize;
    local_38 = __errno_location();
    do {
      outSize = local_50;
      iVar1 = *local_38;
      if ((iVar1 == 0x54) || (iVar1 == 0x16)) {
        UVar3 = 0x80;
        if ((iVar1 == 0x16) && (local_58 < 2)) {
          iconv(cpc->hIConv,(char **)0x0,(size_t *)0x0,&local_60,&local_40);
          UVar3 = '\x01';
        }
        goto LAB_001229ff;
      }
      if (pcVar2 != (char *)0x0) {
        UVar3 = '\x10';
        goto LAB_001229ff;
      }
      if (pcVar6 == local_60) {
        UVar3 = 0xf0;
        goto LAB_001229ff;
      }
      lVar8 = (long)local_60 - (long)*outStr;
      sVar4 = sVar4 + local_58 * 2;
      pcVar6 = (char *)realloc(*outStr,sVar4);
      *outStr = pcVar6;
      pcVar6 = pcVar6 + lVar8;
      local_40 = sVar4 - lVar8;
      local_60 = pcVar6;
      sVar5 = iconv(cpc->hIConv,&local_48,&local_58,&local_60,&local_40);
    } while (sVar5 == 0xffffffffffffffff);
    UVar3 = '\0';
    outSize = local_50;
  }
  else {
    UVar3 = '\0';
  }
LAB_001229ff:
  sVar7 = (long)local_60 - (long)*outStr;
LAB_00122a08:
  *outSize = sVar7;
  return UVar3;
}

Assistant:

UINT8 CPConv_StrConvert(CPCONV* cpc, size_t* outSize, char** outStr, size_t inSize, const char* inStr)
{
	size_t outBufSize;
	size_t remBytesIn;
	size_t remBytesOut;
	char* inPtr;
	char* outPtr;
	size_t wrtBytes;
	char resVal;
	UINT8 canRealloc;
	char* outPtrPrev;
	
	iconv(cpc->hIConv, NULL, NULL, NULL, NULL);	// reset conversion state
	
	if (! inSize)
		inSize = GetStrSize(inStr, cpc->cpfCharSize) + cpc->cpfCharSize;	// include \0 terminator
	remBytesIn = inSize;
	inPtr = (char*)&inStr[0];	// const-cast due to a bug in the iconv API
	if (remBytesIn == 0)
	{
		*outSize = 0;
		return 0x00;	// nothing to convert
	}
	
	if (*outStr == NULL)
	{
		outBufSize = remBytesIn * cpc->cptCharSize * 3 / 2 / cpc->cpfCharSize;
		*outStr = (char*)malloc(outBufSize);
		canRealloc = 1;
	}
	else
	{
		outBufSize = *outSize;
		canRealloc = 0;
	}
	remBytesOut = outBufSize;
	outPtr = *outStr;
	
	resVal = 0x00;	// default: conversion successfull
	outPtrPrev = NULL;
	wrtBytes = iconv(cpc->hIConv, &inPtr, &remBytesIn, &outPtr, &remBytesOut);
	while(wrtBytes == (size_t)-1)
	{
		int err = errno;
		if (err == EILSEQ || err == EINVAL)
		{
			// invalid encoding
			resVal = 0x80;
			if (err == EINVAL && remBytesIn <= 1)
			{
				// assume that the string got truncated
				iconv(cpc->hIConv, NULL, NULL, &outPtr, &remBytesOut);
				resVal = 0x01;	// conversion incomplete due to input error
			}
			break;
		}
		// err == E2BIG
		if (! canRealloc)
		{
			resVal = 0x10;	// conversion incomplete due to lack of buffer space
			break;
		}
		if (outPtrPrev == outPtr)
		{
			resVal = 0xF0;	// unexpected conversion error
			break;
		}
		wrtBytes = outPtr - *outStr;
		outBufSize += remBytesIn * 2;
		*outStr = (char*)realloc(*outStr, outBufSize);
		outPtr = *outStr + wrtBytes;
		remBytesOut = outBufSize - wrtBytes;
		
		outPtrPrev = outPtr;
		wrtBytes = iconv(cpc->hIConv, &inPtr, &remBytesIn, &outPtr, &remBytesOut);
	}
	
	*outSize = outPtr - *outStr;
	return resVal;
}